

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_split_128(secp256k1_scalar *r1,secp256k1_scalar *r2,secp256k1_scalar *k)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  secp256k1_scalar_verify((secp256k1_scalar *)0x13957b);
  *in_RDI = *in_RDX;
  in_RDI[1] = in_RDX[1];
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RSI = in_RDX[2];
  in_RSI[1] = in_RDX[3];
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)0x1395fa);
  secp256k1_scalar_verify((secp256k1_scalar *)0x139604);
  return;
}

Assistant:

static void secp256k1_scalar_split_128(secp256k1_scalar *r1, secp256k1_scalar *r2, const secp256k1_scalar *k) {
    SECP256K1_SCALAR_VERIFY(k);

    r1->d[0] = k->d[0];
    r1->d[1] = k->d[1];
    r1->d[2] = 0;
    r1->d[3] = 0;
    r2->d[0] = k->d[2];
    r2->d[1] = k->d[3];
    r2->d[2] = 0;
    r2->d[3] = 0;

    SECP256K1_SCALAR_VERIFY(r1);
    SECP256K1_SCALAR_VERIFY(r2);
}